

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void test_gej_cmov(secp256k1_gej *a,secp256k1_gej *b)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  secp256k1_gej *psVar4;
  secp256k1_gej *psVar5;
  char *pcVar6;
  secp256k1_gej t;
  
  psVar4 = a;
  psVar5 = &t;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(uint64_t *)psVar5 = (psVar4->x).n[0];
    psVar4 = (secp256k1_gej *)((psVar4->x).n + 1);
    psVar5 = (secp256k1_gej *)((long)psVar5 + 8);
  }
  secp256k1_gej_cmov(&t,b,0);
  iVar1 = gej_xyz_equals_gej(&t,a);
  if (iVar1 == 0) {
    pcVar6 = "test condition failed: gej_xyz_equals_gej(&t, a)";
    uVar3 = 0xfb9;
  }
  else {
    secp256k1_gej_cmov(&t,b,1);
    iVar1 = gej_xyz_equals_gej(&t,b);
    if (iVar1 != 0) {
      return;
    }
    pcVar6 = "test condition failed: gej_xyz_equals_gej(&t, b)";
    uVar3 = 0xfbb;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/TheCharlatan[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar3,pcVar6);
  abort();
}

Assistant:

static void test_gej_cmov(const secp256k1_gej *a, const secp256k1_gej *b) {
    secp256k1_gej t = *a;
    secp256k1_gej_cmov(&t, b, 0);
    CHECK(gej_xyz_equals_gej(&t, a));
    secp256k1_gej_cmov(&t, b, 1);
    CHECK(gej_xyz_equals_gej(&t, b));
}